

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O1

xmlChar * xml_secure_vprint(char *format,__va_list_tag *ap)

{
  undefined8 uVar1;
  uint __errnum;
  uint uVar2;
  char *pcVar3;
  xmlChar *pxVar4;
  va_list ap_store;
  char buf [100];
  char local_98 [104];
  
  __errnum = __vsnprintf_chk(local_98,100,1,100,format);
  if ((int)__errnum < 0) {
LAB_0010ea7e:
    uVar1 = _stderr;
    pcVar3 = strerror(__errnum);
    __fprintf_chk(uVar1,1,"vsnprintf failed in xml_secure_vprint: %s\n",pcVar3);
  }
  else {
    pcVar3 = local_98;
    if (__errnum < 100) {
LAB_0010ea1b:
      pxVar4 = xmlEscapePropValue(pcVar3);
      if (pcVar3 != local_98) {
        free(pcVar3);
      }
      return pxVar4;
    }
    pcVar3 = (char *)malloc((ulong)(__errnum + 1));
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "memory allocation failure in xml_secure_vprint\n";
    }
    else {
      uVar2 = __vsnprintf_chk(pcVar3,(ulong)(__errnum + 1),1,0xffffffffffffffff,format,ap);
      if ((int)uVar2 < 0) {
        free(pcVar3);
        __errnum = uVar2;
        goto LAB_0010ea7e;
      }
      if (uVar2 <= __errnum) goto LAB_0010ea1b;
      free(pcVar3);
      pcVar3 = "vsnprintf failed in xml_secure_vprint: nondeterministic message length\n";
    }
    __fprintf_chk(_stderr,1,pcVar3);
  }
  exit(1);
}

Assistant:

static xmlChar* xml_secure_vprint(const char *format, va_list ap)
{
    char buf[100];
    char *msg = buf;
    const size_t len = sizeof(buf);

    va_list ap_store;
    va_copy(ap_store, ap);
    int res = vsnprintf(msg, len, format, ap_store);
    va_end(ap_store);
    if (res < 0) {
        fprintf(stderr, "vsnprintf failed in xml_secure_vprint: %s\n", strerror(res));
        exit(EXIT_FAILURE);
    }

    if ((unsigned)res >= len) {
        size_t msglen = res+1;
        msg = malloc(msglen);
        if (!msg) {
            fprintf(stderr, "memory allocation failure in xml_secure_vprint\n");
            exit(EXIT_FAILURE);
        }
        res = vsnprintf(msg, msglen, format, ap);
        if (res < 0) {
            free(msg);
            fprintf(stderr, "vsnprintf failed in xml_secure_vprint: %s\n", strerror(res));
            exit(EXIT_FAILURE);
        }
        if ((unsigned)res >= msglen) {
            // What? Did format get longer while allocating msg?
            free(msg);
            fprintf(stderr, "vsnprintf failed in xml_secure_vprint: nondeterministic message length\n");
            exit(EXIT_FAILURE);
        }
    }

    xmlChar *xml_msg = xmlEscapePropValue(msg);
    if (msg != buf) free(msg);
    return xml_msg;
}